

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

ComplexTypeInfo * __thiscall
xercesc_4_0::TraverseSchema::getElementComplexTypeInfo
          (TraverseSchema *this,DOMElement *elem,XMLCh *typeStr,XMLCh *otherSchemaURI)

{
  XMLBuffer *this_00;
  SchemaInfo **enclosingSchema;
  uint saveScope;
  SchemaInfo *toRestore;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar1;
  XMLSize_t XVar2;
  bool bVar3;
  uint namespaceURI;
  int iVar4;
  XMLCh *chars;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  Grammar *pGVar7;
  ComplexTypeInfo *pCVar8;
  SchemaInfo *toRestore_00;
  DOMElement *elem_00;
  undefined4 extraout_var;
  ListType aListType;
  XMLBuffer buffCopy;
  
  chars = getLocalPart(this,typeStr);
  pXVar5 = getPrefix(this,typeStr);
  pXVar6 = otherSchemaURI;
  if (otherSchemaURI == (XMLCh *)0x0) {
    pXVar6 = resolvePrefixToURI(this,elem,pXVar5);
  }
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  this_00 = &this->fBuffer;
  XMLBuffer::set(this_00,pXVar6);
  XMLBuffer::append(this_00,L',');
  XMLBuffer::append(this_00,chars);
  if (otherSchemaURI == (XMLCh *)0x0) {
    pRVar1 = this->fComplexTypeRegistry;
    pXVar5 = (this->fBuffer).fBuffer;
    pXVar5[(this->fBuffer).fIndex] = L'\0';
    pCVar8 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                       (pRVar1,pXVar5);
    aListType = INCLUDE;
    if (pCVar8 == (ComplexTypeInfo *)0x0) {
LAB_0031b25d:
      bVar3 = XMLString::equals(pXVar6,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      if ((!bVar3) ||
         (bVar3 = XMLString::equals(this->fTargetNSURIString,
                                    (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA), bVar3)) {
        pCVar8 = (ComplexTypeInfo *)0x0;
        elem_00 = SchemaInfo::getTopLevelComponent
                            (*enclosingSchema,0,(XMLCh *)SchemaSymbols::fgELT_COMPLEXTYPE,chars,
                             enclosingSchema);
        if (elem_00 != (DOMElement *)0x0) {
          XVar2 = (this->fBuffer).fIndex;
          buffCopy.fMemoryManager = this->fMemoryManager;
          buffCopy.fCapacity = XVar2 + 1;
          buffCopy.fIndex = 0;
          buffCopy.fFullSize = 0;
          buffCopy.fUsed = false;
          buffCopy.fFullHandler = (XMLBufferFullHandler *)0x0;
          iVar4 = (*(buffCopy.fMemoryManager)->_vptr_MemoryManager[3])
                            (buffCopy.fMemoryManager,XVar2 * 2 + 4);
          buffCopy.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar4);
          *buffCopy.fBuffer = L'\0';
          pXVar6 = (this->fBuffer).fBuffer;
          pXVar6[(this->fBuffer).fIndex] = L'\0';
          XMLBuffer::set(&buffCopy,pXVar6);
          traverseComplexTypeDecl(this,elem_00,true,(XMLCh *)0x0);
          pRVar1 = this->fComplexTypeRegistry;
          buffCopy.fBuffer[buffCopy.fIndex] = L'\0';
          pCVar8 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                             (pRVar1,buffCopy.fBuffer);
          XMLBuffer::~XMLBuffer(&buffCopy);
        }
      }
      else {
        pCVar8 = (ComplexTypeInfo *)0x0;
      }
    }
    restoreSchemaInfo(this,toRestore,aListType,saveScope);
  }
  else {
    namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fURIStringPool,pXVar6);
    bVar3 = isImportingNS(this,namespaceURI);
    if (((bVar3) &&
        (pGVar7 = GrammarResolver::getGrammar(this->fGrammarResolver,pXVar6),
        pGVar7 != (Grammar *)0x0)) &&
       (iVar4 = (*(pGVar7->super_XSerializable)._vptr_XSerializable[5])(pGVar7), iVar4 == 1)) {
      pRVar1 = (RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)
               pGVar7[7].super_XSerializable._vptr_XSerializable;
      pXVar5 = (this->fBuffer).fBuffer;
      pXVar5[(this->fBuffer).fIndex] = L'\0';
      pCVar8 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                         (pRVar1,pXVar5);
      if (pCVar8 != (ComplexTypeInfo *)0x0) {
        return pCVar8;
      }
      toRestore_00 = SchemaInfo::getImportInfo(*enclosingSchema,namespaceURI);
      if ((toRestore_00 != (SchemaInfo *)0x0) && (toRestore_00->fProcessed == false)) {
        aListType = IMPORT;
        restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
        goto LAB_0031b25d;
      }
    }
    pCVar8 = (ComplexTypeInfo *)0x0;
  }
  return pCVar8;
}

Assistant:

ComplexTypeInfo*
TraverseSchema::getElementComplexTypeInfo(const DOMElement* const elem,
                                          const XMLCh* const typeStr,
                                          const XMLCh* const otherSchemaURI)
{
    const XMLCh*         localPart = getLocalPart(typeStr);
    const XMLCh*         prefix = getPrefix(typeStr);
    const XMLCh*         typeURI = (otherSchemaURI) ? otherSchemaURI : resolvePrefixToURI(elem, prefix);
    ComplexTypeInfo*     typeInfo = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    fBuffer.set(typeURI);
    fBuffer.append(chComma);
    fBuffer.append(localPart);

    if (otherSchemaURI != 0) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(typeURI);

        if (!isImportingNS(uriId))
            return 0;

        Grammar* aGrammar = fGrammarResolver->getGrammar(typeURI);

        if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {
            return 0;
        }

        typeInfo = ((SchemaGrammar*)aGrammar)->getComplexTypeRegistry()->get(fBuffer.getRawBuffer());

        if (typeInfo) {
            return typeInfo;
        }

        SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

        if (!impInfo || impInfo->getProcessed()) {
            return 0;
        }

        infoType = SchemaInfo::IMPORT;
        restoreSchemaInfo(impInfo, infoType);
    }
    else {
        typeInfo = fComplexTypeRegistry->get(fBuffer.getRawBuffer());
    }

    if (!typeInfo) {
        if (!XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA) ||
            XMLString::equals(fTargetNSURIString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

            DOMElement* typeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_ComplexType,
                SchemaSymbols::fgELT_COMPLEXTYPE, localPart, &fSchemaInfo);

            if (typeNode) {
                // fBuffer is reused by traverseComplexTypeDecl, so we have to store its current value
                XMLBuffer buffCopy(fBuffer.getLen()+1, fMemoryManager);
                buffCopy.set(fBuffer.getRawBuffer());
                traverseComplexTypeDecl(typeNode);
                typeInfo =  fComplexTypeRegistry->get(buffCopy.getRawBuffer());
            }
        }
    }

    // restore schema information
    restoreSchemaInfo(saveInfo, infoType, saveScope);
    return typeInfo;
}